

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O0

void deqp::gles3::Accuracy::randomPartition
               (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *dst,Random *rnd,
               int x,int y,int width,int height)

{
  Random *this;
  int iVar1;
  float fVar2;
  byte local_4e;
  bool local_4d;
  Vector<int,_4> local_4c;
  int local_3c;
  int local_38;
  int split_1;
  int split;
  bool partitionY;
  bool partitionX;
  undefined4 uStack_2c;
  bool partition;
  int minHeight;
  int minWidth;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  Random *rnd_local;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *dst_local;
  
  uStack_2c = 8;
  split = 8;
  minHeight = height;
  minWidth = width;
  height_local = y;
  width_local = x;
  _y_local = rnd;
  rnd_local = (Random *)dst;
  fVar2 = de::Random::getFloat(rnd);
  split_1._3_1_ = 0.4 < fVar2;
  local_4d = false;
  if (((bool)split_1._3_1_) && (local_4d = false, 8 < minWidth)) {
    local_4d = de::Random::getBool(_y_local);
  }
  this = rnd_local;
  split_1._2_1_ = local_4d;
  local_4e = 0;
  if (((split_1._3_1_ & 1) != 0) && (local_4e = 0, 8 < minHeight)) {
    local_4e = local_4d ^ 0xff;
  }
  split_1._1_1_ = local_4e & 1;
  if (local_4d == false) {
    if (split_1._1_1_ == 0) {
      tcu::Vector<int,_4>::Vector(&local_4c,width_local,height_local,minWidth,minHeight);
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)this,
                 &local_4c);
    }
    else {
      iVar1 = minHeight / 2;
      local_3c = de::Random::getInt(_y_local,-minHeight / 4,minHeight / 4);
      local_3c = iVar1 + local_3c;
      randomPartition((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                      rnd_local,_y_local,width_local,height_local,minWidth,local_3c);
      randomPartition((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                      rnd_local,_y_local,width_local,height_local + local_3c,minWidth,
                      minHeight - local_3c);
    }
  }
  else {
    iVar1 = minWidth / 2;
    local_38 = de::Random::getInt(_y_local,-minWidth / 4,minWidth / 4);
    local_38 = iVar1 + local_38;
    randomPartition((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)rnd_local,
                    _y_local,width_local,height_local,local_38,minHeight);
    randomPartition((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)rnd_local,
                    _y_local,width_local + local_38,height_local,minWidth - local_38,minHeight);
  }
  return;
}

Assistant:

static void randomPartition (vector<IVec4>& dst, de::Random& rnd, int x, int y, int width, int height)
{
	const int minWidth	= 8;
	const int minHeight	= 8;

	bool	partition		= rnd.getFloat() > 0.4f;
	bool	partitionX		= partition && width > minWidth && rnd.getBool();
	bool	partitionY		= partition && height > minHeight && !partitionX;

	if (partitionX)
	{
		int split = width/2 + rnd.getInt(-width/4, +width/4);
		randomPartition(dst, rnd, x, y, split, height);
		randomPartition(dst, rnd, x+split, y, width-split, height);
	}
	else if (partitionY)
	{
		int split = height/2 + rnd.getInt(-height/4, +height/4);
		randomPartition(dst, rnd, x, y, width, split);
		randomPartition(dst, rnd, x, y+split, width, height-split);
	}
	else
		dst.push_back(IVec4(x, y, width, height));
}